

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordTaggerValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)2001>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  uint uVar4;
  Pipeline *pPVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Type *pTVar11;
  FeatureType *pFVar12;
  long *plVar13;
  SequenceFeatureType *pSVar14;
  ostream *poVar15;
  ulong *puVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  _Alloc_hider _Var20;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  bool bVar21;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  allocator_type local_221;
  Pipeline *local_220;
  undefined1 local_218 [8];
  _Alloc_hider local_210;
  undefined1 local_208 [24];
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  RepeatedPtrFieldBase *local_1e0;
  ModelDescription *local_1d8;
  TypeCase local_1cc;
  Result *local_1c8;
  CoreML *local_1c0;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d8 = format->description_;
  if (local_1d8 == (ModelDescription *)0x0) {
    local_1d8 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] == 0x7d1) {
    local_220 = (format->Type_).pipeline_;
    bVar21 = ((local_220->models_).super_RepeatedPtrFieldBase.rep_)->elements[0] != (void *)0x0;
    uVar6 = bVar21 + 1;
    if (*(long *)(*(long *)&(local_220->models_).super_RepeatedPtrFieldBase.current_size_ + 8) == 0)
    {
      uVar6 = (uint)bVar21;
    }
    uVar4 = (uint)(*(long *)(*(long *)&(local_220->names_).super_RepeatedPtrFieldBase.current_size_
                            + 8) == 0);
    uVar6 = (uVar6 - (*(long *)((local_220->names_).super_RepeatedPtrFieldBase.arena_ + 8) == 0)) +
            2;
    if ((local_1d8->output_).super_RepeatedPtrFieldBase.current_size_ == uVar6 - uVar4) {
      if (uVar6 != uVar4) {
        local_1c0 = (CoreML *)&local_1d8->input_;
        local_1e0 = &(local_1d8->output_).super_RepeatedPtrFieldBase;
        iVar17 = 0;
        local_1e8 = -1;
        local_1e4 = -1;
        local_1ec = -1;
        local_1f0 = -1;
        local_1c8 = __return_storage_ptr__;
        do {
          pPVar5 = local_220;
          pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              (local_1e0,iVar17);
          psVar2 = (pTVar11->name_).ptr_;
          pcVar3 = (psVar2->_M_dataplus)._M_p;
          local_1b8 = (undefined1  [8])local_1a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1b8,pcVar3,pcVar3 + psVar2->_M_string_length);
          iVar7 = std::__cxx11::string::compare
                            (*(string **)&(pPVar5->models_).super_RepeatedPtrFieldBase.current_size_
                            );
          if (iVar7 == 0) {
            local_1e8 = iVar17;
          }
          iVar8 = std::__cxx11::string::compare
                            ((string *)(pPVar5->models_).super_RepeatedPtrFieldBase.rep_);
          if (iVar8 == 0) {
            local_1e4 = iVar17;
          }
          iVar9 = std::__cxx11::string::compare
                            ((string *)(pPVar5->names_).super_RepeatedPtrFieldBase.arena_);
          if (iVar9 == 0) {
            local_1ec = iVar17;
          }
          iVar10 = std::__cxx11::string::compare
                             (*(string **)&(pPVar5->names_).super_RepeatedPtrFieldBase.current_size_
                             );
          if (iVar10 == 0) {
            local_1f0 = iVar17;
          }
          if ((((iVar7 != 0) && (iVar8 != 0)) && (iVar9 != 0)) && (iVar10 != 0)) {
            std::operator+(&local_248,"Output feature \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8);
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_248);
            __return_storage_ptr__ = local_1c8;
            puVar16 = (ulong *)(plVar13 + 2);
            if ((ulong *)*plVar13 == puVar16) {
              local_208._0_8_ = *puVar16;
              local_208._8_8_ = plVar13[3];
              local_218 = (undefined1  [8])local_208;
            }
            else {
              local_208._0_8_ = *puVar16;
              local_218 = (undefined1  [8])*plVar13;
            }
            local_210._M_p = (pointer)plVar13[1];
            *plVar13 = (long)puVar16;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            Result::Result(local_1c8,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)local_218);
            if (local_218 != (undefined1  [8])local_208) {
              operator_delete((void *)local_218,local_208._0_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            uVar18 = local_1a8._0_8_;
            _Var20._M_p = (pointer)local_1b8;
            if (local_1b8 == (undefined1  [8])local_1a8) {
              return __return_storage_ptr__;
            }
            goto LAB_0029afd8;
          }
          if (local_1b8 != (undefined1  [8])local_1a8) {
            operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
          }
          __return_storage_ptr__ = local_1c8;
          iVar7 = local_1e4;
          iVar17 = iVar17 + 1;
        } while (iVar17 < (local_1d8->output_).super_RepeatedPtrFieldBase.current_size_);
        if (local_1e4 != -1) {
          Result::Result((Result *)local_218);
          local_1cc = kStringType;
          __l._M_len = 1;
          __l._M_array = &local_1cc;
          std::
          vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                    *)&local_248,__l,&local_221);
          validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                    ((Result *)local_1b8,local_1c0,
                     (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
                     (int)&local_248,in_R8);
          local_218 = local_1b8;
          std::__cxx11::string::operator=((string *)&local_210,(string *)&local_1b0);
          if (local_1b0._M_p != local_1a8 + 8) {
            operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
          }
          if (local_248._M_dataplus._M_p != (char *)0x0) {
            operator_delete(local_248._M_dataplus._M_p,
                            local_248.field_2._M_allocated_capacity -
                            (long)local_248._M_dataplus._M_p);
          }
          bVar21 = Result::good((Result *)local_218);
          if (bVar21) {
            uVar6 = (local_1d8->output_).super_RepeatedPtrFieldBase.current_size_;
            local_1cc = kSequenceType;
            __l_00._M_len = 1;
            __l_00._M_array = &local_1cc;
            std::
            vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                      *)&local_248,__l_00,&local_221);
            validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                      ((Result *)local_1b8,(CoreML *)local_1e0,
                       (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)(ulong)uVar6,
                       (int)&local_248,in_R8);
            local_218 = local_1b8;
            std::__cxx11::string::operator=((string *)&local_210,(string *)&local_1b0);
            if (local_1b0._M_p != local_1a8 + 8) {
              operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
            }
            if (local_248._M_dataplus._M_p != (char *)0x0) {
              operator_delete(local_248._M_dataplus._M_p,
                              local_248.field_2._M_allocated_capacity -
                              (long)local_248._M_dataplus._M_p);
            }
            bVar21 = Result::good((Result *)local_218);
            if (!bVar21) goto LAB_0029b4ca;
            pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_1e0,iVar7);
            pFVar12 = pTVar11->type_;
            if (pFVar12 == (FeatureType *)0x0) {
              pFVar12 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar12->_oneof_case_[0] == 7) {
              pSVar14 = (pFVar12->Type_).sequencetype_;
            }
            else {
              pSVar14 = Specification::SequenceFeatureType::default_instance();
            }
            if (pSVar14->_oneof_case_[0] == 3) {
              if (local_1e8 != -1) {
                pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                    (local_1e0,local_1e8);
                pFVar12 = pTVar11->type_;
                if (pFVar12 == (FeatureType *)0x0) {
                  pFVar12 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                if (pFVar12->_oneof_case_[0] == 7) {
                  pSVar14 = (pFVar12->Type_).sequencetype_;
                }
                else {
                  pSVar14 = Specification::SequenceFeatureType::default_instance();
                }
                if (pSVar14->_oneof_case_[0] != 3) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Unsupported type \"",0x12);
                  if ((ulong)pSVar14->_oneof_case_[0] < 8) {
                    pcVar19 = (&PTR_anon_var_dwarf_43bd63_003c4a08)[pSVar14->_oneof_case_[0]];
                  }
                  else {
                    pcVar19 = "INVALID";
                  }
                  poVar15 = std::operator<<((ostream *)local_1a8,pcVar19);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,"\" for feature \"",0xf);
                  std::operator+(&local_248,
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)&(local_220->models_).super_RepeatedPtrFieldBase.current_size_
                                 ,"\". Should be: ");
                  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar15,local_248._M_dataplus._M_p,local_248._M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,"MLFeatureTypeType_stringType",0x1c);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p != &local_248.field_2) {
                    operator_delete(local_248._M_dataplus._M_p,
                                    local_248.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::stringbuf::str();
                  Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_248)
                  ;
                  goto LAB_0029b71a;
                }
              }
              if (local_1ec != -1) {
                pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                    (local_1e0,local_1ec);
                pFVar12 = pTVar11->type_;
                if (pFVar12 == (FeatureType *)0x0) {
                  pFVar12 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                if (pFVar12->_oneof_case_[0] == 7) {
                  pSVar14 = (pFVar12->Type_).sequencetype_;
                }
                else {
                  pSVar14 = Specification::SequenceFeatureType::default_instance();
                }
                if (pSVar14->_oneof_case_[0] != 1) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Unsupported type \"",0x12);
                  if ((ulong)pSVar14->_oneof_case_[0] < 8) {
                    pcVar19 = (&PTR_anon_var_dwarf_43bd63_003c4a08)[pSVar14->_oneof_case_[0]];
                  }
                  else {
                    pcVar19 = "INVALID";
                  }
                  poVar15 = std::operator<<((ostream *)local_1a8,pcVar19);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,"\" for feature \"",0xf);
                  std::operator+(&local_248,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(local_220->names_).super_RepeatedPtrFieldBase.arena_,
                                 "\". Should be: ");
                  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar15,local_248._M_dataplus._M_p,local_248._M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,"MLFeatureTypeType_int64Type",0x1b);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p != &local_248.field_2) {
                    operator_delete(local_248._M_dataplus._M_p,
                                    local_248.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::stringbuf::str();
                  Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_248)
                  ;
                  goto LAB_0029b71a;
                }
              }
              if (local_1f0 != -1) {
                pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                    (local_1e0,local_1f0);
                pFVar12 = pTVar11->type_;
                if (pFVar12 == (FeatureType *)0x0) {
                  pFVar12 = (FeatureType *)&Specification::_FeatureType_default_instance_;
                }
                if (pFVar12->_oneof_case_[0] == 7) {
                  pSVar14 = (pFVar12->Type_).sequencetype_;
                }
                else {
                  pSVar14 = Specification::SequenceFeatureType::default_instance();
                }
                if (pSVar14->_oneof_case_[0] != 1) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"Unsupported type \"",0x12);
                  if ((ulong)pSVar14->_oneof_case_[0] < 8) {
                    pcVar19 = (&PTR_anon_var_dwarf_43bd63_003c4a08)[pSVar14->_oneof_case_[0]];
                  }
                  else {
                    pcVar19 = "INVALID";
                  }
                  poVar15 = std::operator<<((ostream *)local_1a8,pcVar19);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,"\" for feature \"",0xf);
                  std::operator+(&local_248,
                                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   **)&(local_220->names_).super_RepeatedPtrFieldBase.current_size_,
                                 "\". Should be: ");
                  poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar15,local_248._M_dataplus._M_p,local_248._M_string_length
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar15,"MLFeatureTypeType_int64Type",0x1b);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_248._M_dataplus._M_p != &local_248.field_2) {
                    operator_delete(local_248._M_dataplus._M_p,
                                    local_248.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::stringbuf::str();
                  Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_248)
                  ;
                  goto LAB_0029b71a;
                }
              }
              if (local_220->_cached_size_ == 0) {
                local_1b8 = (undefined1  [8])local_1a8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1b8,"Model revision number not set. Must be >= 1","");
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
              }
              else {
                iVar17 = *(int *)((long)&local_220[1]._internal_metadata_.
                                         super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                                         .ptr_ + 4);
                if ((iVar17 == 0) ||
                   ((iVar17 == 200 &&
                    (*(int *)(local_220[1].super_MessageLite._vptr_MessageLite + 3) < 1)))) {
                  local_1b8 = (undefined1  [8])local_1a8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1b8,
                             "Model output tags not set. Must have at least one tag","");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8
                                );
                }
                else {
                  if (((local_220->names_).super_RepeatedPtrFieldBase.rep_)->elements[0] !=
                      (void *)0x0) goto LAB_0029b4ca;
                  local_1b8 = (undefined1  [8])local_1a8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1b8,"Model parameter data not set","");
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8
                                );
                }
              }
              if (local_1b8 != (undefined1  [8])local_1a8) {
                operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
              }
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"Unsupported type \"",0x12);
              if ((ulong)pSVar14->_oneof_case_[0] < 8) {
                pcVar19 = (&PTR_anon_var_dwarf_43bd63_003c4a08)[pSVar14->_oneof_case_[0]];
              }
              else {
                pcVar19 = "INVALID";
              }
              poVar15 = std::operator<<((ostream *)local_1a8,pcVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" for feature \"",0xf);
              std::operator+(&local_248,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_220->models_).super_RepeatedPtrFieldBase.rep_,"\". Should be: ")
              ;
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,local_248._M_dataplus._M_p,local_248._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,"MLFeatureTypeType_stringType",0x1c);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,FEATURE_TYPE_INVARIANT_VIOLATION,&local_248);
LAB_0029b71a:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base(local_138);
            }
          }
          else {
LAB_0029b4ca:
            __return_storage_ptr__->m_type = local_218._0_4_;
            __return_storage_ptr__->m_reason = local_218._4_4_;
            paVar1 = &(__return_storage_ptr__->m_message).field_2;
            (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
            if (local_210._M_p == local_208 + 8) {
              paVar1->_M_allocated_capacity = local_208._8_8_;
              *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                   local_208._16_8_;
            }
            else {
              (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_210._M_p;
              (__return_storage_ptr__->m_message).field_2._M_allocated_capacity = local_208._8_8_;
            }
            (__return_storage_ptr__->m_message)._M_string_length = local_208._0_8_;
            local_208._0_8_ = 0;
            local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
            local_210._M_p = local_208 + 8;
          }
          uVar18 = local_208._8_8_;
          _Var20._M_p = local_210._M_p;
          if (local_210._M_p == local_208 + 8) {
            return __return_storage_ptr__;
          }
          goto LAB_0029afd8;
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                     "Expected feature \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_220->models_).super_RepeatedPtrFieldBase.rep_);
      plVar13 = (long *)std::__cxx11::string::append((char *)local_218);
      puVar16 = (ulong *)(plVar13 + 2);
      if ((ulong *)*plVar13 == puVar16) {
        local_1a8._0_8_ = *puVar16;
        local_1a8._8_8_ = plVar13[3];
        local_1b8 = (undefined1  [8])local_1a8;
      }
      else {
        local_1a8._0_8_ = *puVar16;
        local_1b8 = (undefined1  [8])*plVar13;
      }
      local_1b0._M_p = (pointer)plVar13[1];
      *plVar13 = (long)puVar16;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      Result::Result(__return_storage_ptr__,INTERFACE_FEATURE_NAME_MISMATCH,(string *)local_1b8);
      if (local_1b8 != (undefined1  [8])local_1a8) {
        operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
      }
      uVar18 = local_208._0_8_;
      _Var20._M_p = (pointer)local_218;
      if (local_218 == (undefined1  [8])local_208) {
        return __return_storage_ptr__;
      }
      goto LAB_0029afd8;
    }
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,
               "More model output features than the output features of the word tagger model.","");
    Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)local_1b8);
  }
  else {
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Model not a word tagger.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
  }
  uVar18 = local_1a8._0_8_;
  _Var20._M_p = (pointer)local_1b8;
  if (local_1b8 == (undefined1  [8])local_1a8) {
    return __return_storage_ptr__;
  }
LAB_0029afd8:
  operator_delete(_Var20._M_p,uVar18 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_wordTagger>(const Specification::Model& format) {
        const auto& interface = format.description();
        const auto& inputs = interface.input();
        const auto& outputs = interface.output();
        
        // make sure model is a word tager
        if (!format.has_wordtagger()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a word tagger.");
        }
        
        const auto& wordTagger = format.wordtagger();
        
        int numNonEmptyOutputFeatures = 0;
        
        if (wordTagger.tokentagsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokensoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlocationsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (wordTagger.tokenlengthsoutputfeaturename().length() > 0) {
            numNonEmptyOutputFeatures++;
        }
        
        if (outputs.size() != numNonEmptyOutputFeatures) {
            return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                          "More model output features than the output features of the word tagger model.");
        }        
        
        int tokensOutputIndex = -1;
        int tokenTagsOutputIndex = -1;
        int tokenLocationsOutputIndex = -1;
        int tokenLengthsOutputIndex = -1;
        
        // check that any interface output can be found from word tagger outputs
        for (int i = 0; i < outputs.size(); i++) {
            const std::string name = outputs[i].name();
            bool present = false;
            
            if (wordTagger.tokensoutputfeaturename().compare(name) == 0) {
                tokensOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokentagsoutputfeaturename().compare(name) == 0) {
                tokenTagsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlocationsoutputfeaturename().compare(name) == 0) {
                tokenLocationsOutputIndex = i;
                present = true;
            }
            
            if (wordTagger.tokenlengthsoutputfeaturename().compare(name) == 0) {
                tokenLengthsOutputIndex = i;
                present = true;
            }
            
            if (!present) {
                return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE,
                              "Output feature '" + name + "' was not required by the output features of the word tagger model.");
            }
        }
        
        // token tags is the required output feature name, while tokens/locations/lengths are optional
        if (tokenTagsOutputIndex == -1) {
            return Result(ResultType::INTERFACE_FEATURE_NAME_MISMATCH,
                          "Expected feature '" + wordTagger.tokentagsoutputfeaturename() + "' (defined by tokenTagsOutputFeatureName) to the model is not present in the model description.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(inputs, 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs: only sequence type is allowed for any output
        result = validateDescriptionsContainFeatureWithTypes(outputs, outputs.size(), {Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }
        
        // validate the individual output type, token tags has to be a sequence of strings
        const auto& tokenTagsOutputSequenceType = outputs[tokenTagsOutputIndex].type().sequencetype();
        if (tokenTagsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
            std::stringstream out;
            out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenTagsOutputSequenceType.Type_case()))
            << "\" for feature \"" << wordTagger.tokentagsoutputfeaturename() + "\". Should be: "
            << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
            
            return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
        }

        // validate the individual output type, tokens (if present) has to be a sequence of strings
        if (tokensOutputIndex != -1) {
            const auto& tokensOutputSequenceType = outputs[tokensOutputIndex].type().sequencetype();
            if (tokensOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kStringType) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokensOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokensoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kStringType));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token locations (if present) has to be a sequence of integers
        if (tokenLocationsOutputIndex != -1) {
            const auto& tokenLocationsOutputSequenceType = outputs[tokenLocationsOutputIndex].type().sequencetype();
            if (tokenLocationsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLocationsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlocationsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // validate the individual output type, token lengths (if present) has to be a sequence of integers
        if (tokenLengthsOutputIndex != -1) {
            const auto& tokenLengthsOutputSequenceType = outputs[tokenLengthsOutputIndex].type().sequencetype();
            if (tokenLengthsOutputSequenceType.Type_case() != Specification::SequenceFeatureType::kInt64Type) {
                std::stringstream out;
                out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(tokenLengthsOutputSequenceType.Type_case()))
                << "\" for feature \"" << wordTagger.tokenlengthsoutputfeaturename() + "\". Should be: "
                << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(Specification::SequenceFeatureType::kInt64Type));
                
                return Result(ResultType::FEATURE_TYPE_INVARIANT_VIOLATION, out.str());
            }
        }
        
        // Validate the model parameters
        if (wordTagger.revision() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number not set. Must be >= 1");
        }

        int numTags;
        switch (wordTagger.Tags_case()) {
            case Specification::CoreMLModels::WordTagger::kStringTags:
                numTags = wordTagger.stringtags().vector_size();
                break;
            case Specification::CoreMLModels::WordTagger::TAGS_NOT_SET:
                numTags = -1;
                break;
        }
        
        if (numTags <= 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model output tags not set. Must have at least one tag");
        }
        
        if (wordTagger.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }